

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleThreadPool.cpp
# Opt level: O2

void __thiscall Source::operator()(Source *this)

{
  result_type_conflict1 rVar1;
  int iVar2;
  duration<long,_std::ratio<1L,_1000L>_> *in_RSI;
  bool bVar3;
  double dVar4;
  duration<long,_std::ratio<1L,_1000L>_> local_40;
  double local_38;
  double local_30;
  
  iVar2 = 7;
  dVar4 = 0.0;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    local_30 = dVar4;
    rVar1 = std::uniform_int_distribution<int>::operator()(&distrib,&gen);
    local_40.__r = (rep)rVar1;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_40);
    local_38 = local_30 + 1.0;
    local_40.__r = (rep)local_30;
    in_RSI = &local_40;
    rtb::Concurrency::Queue<double>::push(this->outputQueue_,(double *)&local_40);
    dVar4 = local_38;
  }
  rtb::Concurrency::Queue<double>::close(this->outputQueue_,(int)in_RSI);
  return;
}

Assistant:

void operator()() {
        int val = 0;
        for(int i{0}; i < 7; ++i) {
            std::this_thread::sleep_for(std::chrono::milliseconds(distrib(gen)));
            outputQueue_.push(val++);
        }
        outputQueue_.close();
    }